

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<unsigned_int>::dispose(ArrayBuilder<unsigned_int> *this)

{
  uint *firstElement;
  RemoveConst<unsigned_int> *pRVar1;
  uint *puVar2;
  uint *endCopy;
  uint *posCopy;
  uint *ptrCopy;
  ArrayBuilder<unsigned_int> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  puVar2 = this->endPtr;
  if (firstElement != (uint *)0x0) {
    this->ptr = (uint *)0x0;
    this->pos = (RemoveConst<unsigned_int> *)0x0;
    this->endPtr = (uint *)0x0;
    ArrayDisposer::dispose<unsigned_int>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 2,
               (long)puVar2 - (long)firstElement >> 2);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }